

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
emplaceRealloc<slang::ast::PrimitiveSymbol::TableEntry>
          (SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *this,pointer pos,
          TableEntry *args)

{
  ulong uVar1;
  pointer p;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  undefined5 uVar5;
  pointer pTVar6;
  long lVar7;
  pointer pTVar8;
  pointer pTVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar1 = this->cap;
  if (uVar12 < uVar1 * 2) {
    uVar12 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar12 = 0x555555555555555;
  }
  lVar10 = (long)pos - (long)this->data_;
  pTVar6 = (pointer)operator_new(uVar12 * 0x18);
  *(undefined8 *)((long)pTVar6 + lVar10 + 0x10) = *(undefined8 *)&args->state;
  pcVar2 = (args->inputs)._M_str;
  *(size_t *)((long)pTVar6 + lVar10) = (args->inputs)._M_len;
  ((size_t *)((long)pTVar6 + lVar10))[1] = (size_t)pcVar2;
  p = this->data_;
  sVar11 = this->len;
  lVar7 = (long)p + (sVar11 * 0x18 - (long)pos);
  pTVar8 = p;
  pTVar9 = pTVar6;
  if (lVar7 == 0) {
    pTVar8 = pTVar6;
    pTVar9 = p;
    if (sVar11 != 0) {
      do {
        cVar3 = pTVar9->output;
        bVar4 = pTVar9->isEdgeSensitive;
        uVar5 = *(undefined5 *)&pTVar9->field_0x13;
        pTVar8->state = pTVar9->state;
        pTVar8->output = cVar3;
        pTVar8->isEdgeSensitive = bVar4;
        *(undefined5 *)&pTVar8->field_0x13 = uVar5;
        pcVar2 = (pTVar9->inputs)._M_str;
        (pTVar8->inputs)._M_len = (pTVar9->inputs)._M_len;
        (pTVar8->inputs)._M_str = pcVar2;
        pTVar9 = pTVar9 + 1;
        pTVar8 = pTVar8 + 1;
      } while (pTVar9 != pos);
    }
  }
  else {
    for (; pTVar8 != pos; pTVar8 = pTVar8 + 1) {
      cVar3 = pTVar8->output;
      bVar4 = pTVar8->isEdgeSensitive;
      uVar5 = *(undefined5 *)&pTVar8->field_0x13;
      pTVar9->state = pTVar8->state;
      pTVar9->output = cVar3;
      pTVar9->isEdgeSensitive = bVar4;
      *(undefined5 *)&pTVar9->field_0x13 = uVar5;
      pcVar2 = (pTVar8->inputs)._M_str;
      (pTVar9->inputs)._M_len = (pTVar8->inputs)._M_len;
      (pTVar9->inputs)._M_str = pcVar2;
      pTVar9 = pTVar9 + 1;
    }
    memcpy((void *)((long)pTVar6 + lVar10 + 0x18),pos,((lVar7 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pTVar6;
  return (pointer)((long)pTVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}